

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_cdata_index(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  char cVar2;
  TRef *pTVar3;
  ushort uVar4;
  ushort uVar5;
  IRRef1 IVar6;
  TRef TVar7;
  uint uVar8;
  IRType IVar9;
  uint uVar10;
  CTSize sz;
  TRef TVar11;
  GCcdata *cd;
  CType *pCVar12;
  CType *ct;
  cTValue *pcVar13;
  byte bVar14;
  CTypeID CVar15;
  uint64_t u64;
  uint uVar16;
  ulong uVar17;
  CType *pCVar18;
  IRRef1 IVar19;
  CTInfo CVar20;
  int iVar21;
  CTState *cts;
  GCobj *o;
  TRef local_54;
  ptrdiff_t ofs;
  CTSize fofs;
  
  local_54 = *J->base;
  ofs = 8;
  cd = argv2cdata(J,local_54,rd->argv);
  cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pCVar12 = cts->tab;
  uVar8 = pCVar12[cd->ctypeid].info;
  ct = pCVar12 + cd->ctypeid;
  if ((uVar8 & 0xf0000000) == 0x20000000) {
    pCVar1 = &ct->size;
    if ((~uVar8 & 0x20800000) == 0) {
      ct = (CType *)((long)&pCVar12->info + (ulong)((uVar8 & 0xffff) << 4));
    }
    (J->fold).ins.field_0.ot = (ushort)(*pCVar1 == 8) * 4 + 0x4405;
    (J->fold).ins.field_0.op1 = (IRRef1)local_54;
    (J->fold).ins.field_0.op2 = 0xf;
    TVar7 = lj_opt_fold(J);
    ofs = 0;
    local_54 = crec_reassoc_ofs(J,TVar7,&ofs,1);
  }
  do {
    uVar8 = J->base[1];
    if ((uVar8 >> 0x18 & 0x1e) - 0xe < 6) {
      uVar8 = lj_opt_narrow_cindex(J,uVar8);
      if ((ct->info & 0xe0000000) == 0x20000000) {
LAB_0015139d:
        uVar10 = ct->info;
        if ((uVar10 >> 0x1a & 1) != 0) {
          TVar7 = lj_ir_kint64(J,1);
          (J->fold).ins.field_0.ot = 0x2115;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
          uVar8 = lj_opt_fold(J);
          uVar10 = (uint)(ushort)ct->info;
        }
        CVar15 = uVar10 & 0xffff;
        sz = lj_ctype_size(cts,CVar15);
        TVar7 = crec_reassoc_ofs(J,uVar8,&ofs,sz);
        TVar11 = lj_ir_kint64(J,(ulong)sz);
        (J->fold).ins.field_0.ot = 0x2b15;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
        uVar8 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)local_54;
        local_54 = lj_opt_fold(J);
LAB_00151455:
        if (CVar15 != 0) {
          if (ofs != 0) {
            TVar7 = lj_ir_kint64(J,ofs);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = (IRRef1)local_54;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            local_54 = lj_opt_fold(J);
          }
          pCVar12 = (CType *)((long)&cts->tab->info + (ulong)(CVar15 << 4));
          if ((*(uint *)((long)&cts->tab->info + (ulong)(CVar15 << 4)) & 0xf0800000) == 0x20800000)
          {
            (J->fold).ins.field_0.op1 = (IRRef1)local_54;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090000;
            local_54 = lj_opt_fold(J);
            uVar5 = (ushort)pCVar12->info;
            CVar15 = (CTypeID)uVar5;
            pCVar12 = cts->tab + uVar5;
          }
          if (rd->data != 0) {
            rd->nres = 0;
            J->needsnap = '\x01';
            crec_ct_tv(J,pCVar12,local_54,J->base[2],rd->argv + 2);
            return;
          }
          TVar7 = crec_tv_ct(J,pCVar12,CVar15,local_54);
LAB_00151a0d:
          *J->base = TVar7;
          return;
        }
      }
    }
    else {
      IVar19 = (IRRef1)uVar8;
      if ((uVar8 & 0x1f000000) == 0x4000000) {
        o = (GCobj *)(ulong)rd->argv[1].u32.lo;
        if ((cd != (GCcdata *)0x0) && (cd->ctypeid == 0x15)) {
          CVar15 = crec_constructor(J,cd,local_54);
          ct = cts->tab + CVar15;
        }
        if ((ct->info & 0xf0000000) == 0x10000000) {
          CVar15 = 0;
          pCVar12 = lj_ctype_getfieldq(cts,ct,&o->str,&fofs,(CTInfo *)0x0);
          if (pCVar12 != (CType *)0x0) {
            u64 = (ulong)fofs + ofs;
            ofs = u64;
            TVar7 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar19;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            lj_opt_fold(J);
            CVar20 = pCVar12->info;
            if (CVar20 >> 0x1c == 10) {
              if (u64 != 0) {
                TVar7 = lj_ir_kint64(J,u64);
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = (IRRef1)local_54;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                local_54 = lj_opt_fold(J);
                CVar20 = pCVar12->info;
              }
              uVar8 = CVar20 >> 0x10 & 0x7f;
              iVar21 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> iVar21 == 0; iVar21 = iVar21 + -1) {
                }
              }
              uVar5 = ((ushort)iVar21 ^ 0x1f) * 2 ^ 0x3e;
              uVar8 = CVar20 & 0x800000;
              uVar4 = (ushort)(uVar8 >> 0x10);
              (J->fold).ins.field_0.ot = (uVar4 >> 7) + uVar5 + 0x450f;
              (J->fold).ins.field_0.op1 = (IRRef1)local_54;
              (J->fold).ins.field_0.op2 = 0;
              TVar7 = lj_opt_fold(J);
              uVar10 = CVar20 & 0x7f;
              uVar16 = CVar20 >> 8 & 0x7f;
              bVar14 = (byte)uVar16;
              IVar19 = (IRRef1)TVar7;
              if (rd->data != 0) {
                uVar5 = uVar5 + (uVar4 >> 7) + 0xf;
                iVar21 = 3;
                if ((CVar20 >> 0x1b & 1) == 0) {
                  iVar21 = 10 - (uint)(uVar8 == 0);
                }
                uVar8 = ~(-1 << (bVar14 & 0x1f)) << ((byte)uVar10 & 0x1f);
                TVar7 = crec_ct_tv(J,(CType *)((ulong)(uint)(iVar21 << 4) +
                                              *(long *)(ulong)J[-1].bpropcache[0xc].mode),0,
                                   J->base[2],rd->argv + 2);
                TVar11 = lj_ir_kint(J,uVar10);
                (J->fold).ins.field_0.ot = 0x2413;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
                TVar7 = lj_opt_fold(J);
                TVar11 = lj_ir_kint(J,uVar8);
                (J->fold).ins.field_0.ot = uVar5 | 0x2100;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
                TVar7 = lj_opt_fold(J);
                TVar11 = lj_ir_kint(J,~uVar8);
                (J->fold).ins.field_0.ot = uVar5 | 0x2100;
                (J->fold).ins.field_0.op1 = IVar19;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
                TVar11 = lj_opt_fold(J);
                (J->fold).ins.field_0.ot = uVar5 | 0x2200;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar7 = lj_opt_fold(J);
                (J->fold).ins.field_0.ot = uVar5 | 0x4c00;
                (J->fold).ins.field_0.op1 = (IRRef1)local_54;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                lj_opt_fold(J);
                rd->nres = 0;
                J->needsnap = '\x01';
                return;
              }
              if ((CVar20 >> 0x1b & 1) == 0) {
                if (uVar8 == 0) {
                  iVar21 = 0x20 - uVar16;
                  TVar7 = lj_ir_kint(J,iVar21 - uVar10);
                  (J->fold).ins.field_0.ot = 0x2413;
                  (J->fold).ins.field_0.op1 = IVar19;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                  TVar7 = lj_opt_fold(J);
                  IVar19 = (IRRef1)TVar7;
                  TVar7 = lj_ir_kint(J,iVar21);
                  IVar6 = (IRRef1)TVar7;
                  (J->fold).ins.field_0.ot = 0x2613;
                }
                else {
                  TVar7 = lj_ir_kint(J,uVar10);
                  (J->fold).ins.field_0.ot = 0x2513;
                  (J->fold).ins.field_0.op1 = IVar19;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                  TVar7 = lj_opt_fold(J);
                  IVar19 = (IRRef1)TVar7;
                  TVar7 = lj_ir_kint(J,~(-1 << (bVar14 & 0x1f)));
                  IVar6 = (IRRef1)TVar7;
                  (J->fold).ins.field_0.ot = 0x2113;
                }
                (J->fold).ins.field_0.op1 = IVar19;
                (J->fold).ins.field_0.op2 = IVar6;
                TVar7 = lj_opt_fold(J);
              }
              else {
                TVar7 = lj_ir_kint(J,1 << ((byte)uVar10 & 0x1f));
                (J->fold).ins.field_0.ot = 0x2113;
                (J->fold).ins.field_0.op1 = IVar19;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar7 = lj_opt_fold(J);
                TVar11 = lj_ir_kint(J,0);
                (J->fold).ins.field_0.ot = 0x993;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
                J->postproc = LJ_POST_FIXGUARD;
                TVar7 = 0x2007ffd;
              }
            }
            else {
              if (CVar20 >> 0x1c != 0xb) {
                CVar15 = CVar20 & 0xffff;
                goto LAB_00151455;
              }
              uVar8 = pCVar12->size;
              if (((int)uVar8 < 0) &&
                 ((*(byte *)((long)&cts->tab->info + (ulong)((CVar20 & 0xffff) << 4) + 2) & 0x80) !=
                  0)) {
                TVar7 = lj_ir_knum_u64(J,(uint64_t)(double)uVar8);
              }
              else {
                TVar7 = lj_ir_kint(J,uVar8);
              }
            }
            goto LAB_00151a0d;
          }
          goto LAB_00151455;
        }
        if (((ct->info & 0xf4000000) == 0x34000000) && ((o->str).len == 2)) {
          cVar2 = (char)(o->gch).metatable.gcptr32;
          if (cVar2 == 'i') {
            if (*(char *)((long)&(o->gch).metatable.gcptr32 + 1) == 'm') goto LAB_001514cd;
          }
          else if ((cVar2 == 'r') && (*(char *)((long)&(o->gch).metatable.gcptr32 + 1) == 'e')) {
LAB_001514cd:
            TVar7 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar19;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            lj_opt_fold(J);
            if ((char)(o->gch).metatable.gcptr32 == 'i') {
              ofs = ofs + (ulong)(ct->size >> 1);
            }
            CVar15 = (CTypeID)(ushort)ct->info;
            goto LAB_00151455;
          }
        }
      }
      else if ((uVar8 & 0x1f000000) == 0xa000000) {
        pCVar12 = cts->tab + *(ushort *)((ulong)rd->argv[1].u32.lo + 6);
        IVar9 = crec_ct2irt(cts,pCVar12);
        if (((ct->info & 0xe0000000) == 0x20000000) && (IRT_NUM < IVar9)) {
          uVar5 = 0x4400;
          if (pCVar12->size == 8) {
            IVar19 = 0x11;
          }
          else if (pCVar12->size == 4) {
            IVar19 = 0x10;
          }
          else {
            TVar7 = lj_ir_kint64(J,8);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar19;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            uVar8 = lj_opt_fold(J);
            uVar5 = 0x4500;
            IVar19 = 0;
          }
          (J->fold).ins.field_0.ot = uVar5 | (ushort)IVar9;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar8;
          (J->fold).ins.field_0.op2 = IVar19;
          uVar8 = lj_opt_fold(J);
          if ((pCVar12->size < 8) && ((pCVar12->info & 0x800000) == 0)) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar8;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x59150ab3;
            uVar8 = lj_opt_fold(J);
          }
          goto LAB_0015139d;
        }
      }
    }
    pCVar12 = cts->tab;
    if ((((ct->info & 0xf0000000) != 0x20000000) ||
        (uVar17 = (ulong)((ct->info & 0xffff) << 4),
        pCVar18 = (CType *)((long)&pCVar12->info + uVar17),
        (*(uint *)((long)&pCVar12->info + uVar17) & 0xf0000000) != 0x10000000)) ||
       (cd = (GCcdata *)0x0, ct = pCVar18, (uVar8 & 0x1f000000) != 0x4000000)) {
      pcVar13 = lj_ctype_meta(cts,(CTypeID)((ulong)((long)ct - (long)pCVar12) >> 4),
                              (uint)(rd->data != 0));
      if (pcVar13 != (cTValue *)0x0) {
        if ((pcVar13->field_2).it == 0xfffffff7) {
          crec_tailcall(J,rd,pcVar13);
          return;
        }
        if ((((pcVar13->field_2).it == 0xfffffff4) && (rd->data == 0)) &&
           ((J->base[1] & 0x1f000000) == 0x4000000)) {
          pcVar13 = lj_tab_get(J->L,(GCtab *)(ulong)(pcVar13->u32).lo,rd->argv + 1);
          TVar7 = lj_record_constify(J,pcVar13);
          pTVar3 = J->base;
          *pTVar3 = TVar7;
          if (TVar7 != 0) {
            TVar7 = pTVar3[1];
            TVar11 = lj_ir_kgc(J,(GCobj *)(ulong)rd->argv[1].u32.lo,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
            lj_opt_fold(J);
            return;
          }
        }
      }
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  } while( true );
}

Assistant:

void LJ_FASTCALL recff_cdata_index(jit_State *J, RecordFFData *rd)
{
  TRef idx, ptr = J->base[0];
  ptrdiff_t ofs = sizeof(GCcdata);
  GCcdata *cd = argv2cdata(J, ptr, &rd->argv[0]);
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTypeID sid = 0;

  /* Resolve pointer or reference for cdata object. */
  if (ctype_isptr(ct->info)) {
    IRType t = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
    ptr = emitir(IRT(IR_FLOAD, t), ptr, IRFL_CDATA_PTR);
    ofs = 0;
    ptr = crec_reassoc_ofs(J, ptr, &ofs, 1);
  }

again:
  idx = J->base[1];
  if (tref_isnumber(idx)) {
    idx = lj_opt_narrow_cindex(J, idx);
    if (ctype_ispointer(ct->info)) {
      CTSize sz;
  integer_key:
      if ((ct->info & CTF_COMPLEX))
	idx = emitir(IRT(IR_BAND, IRT_INTP), idx, lj_ir_kintp(J, 1));
      sz = lj_ctype_size(cts, (sid = ctype_cid(ct->info)));
      idx = crec_reassoc_ofs(J, idx, &ofs, sz);
#if LJ_TARGET_ARM || LJ_TARGET_PPC
      /* Hoist base add to allow fusion of index/shift into operands. */
      if (LJ_LIKELY(J->flags & JIT_F_OPT_LOOP) && ofs
#if LJ_TARGET_ARM
	  && (sz == 1 || sz == 4)
#endif
	  ) {
	ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	ofs = 0;
      }
#endif
      idx = emitir(IRT(IR_MUL, IRT_INTP), idx, lj_ir_kintp(J, sz));
      ptr = emitir(IRT(IR_ADD, IRT_PTR), idx, ptr);
    }
  } else if (tref_iscdata(idx)) {
    GCcdata *cdk = cdataV(&rd->argv[1]);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    IRType t = crec_ct2irt(cts, ctk);
    if (ctype_ispointer(ct->info) && t >= IRT_I8 && t <= IRT_U64) {
      if (ctk->size == 8) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT64);
      } else if (ctk->size == 4) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT);
      } else {
	idx = emitir(IRT(IR_ADD, IRT_PTR), idx,
		     lj_ir_kintp(J, sizeof(GCcdata)));
	idx = emitir(IRT(IR_XLOAD, t), idx, 0);
      }
      if (LJ_64 && ctk->size < sizeof(intptr_t) && !(ctk->info & CTF_UNSIGNED))
	idx = emitconv(idx, IRT_INTP, IRT_INT, IRCONV_SEXT);
      if (!LJ_64 && ctk->size > sizeof(intptr_t)) {
	idx = emitconv(idx, IRT_INTP, t, 0);
	lj_needsplit(J);
      }
      goto integer_key;
    }
  } else if (tref_isstr(idx)) {
    GCstr *name = strV(&rd->argv[1]);
    if (cd && cd->ctypeid == CTID_CTYPEID)
      ct = ctype_raw(cts, crec_constructor(J, cd, ptr));
    if (ctype_isstruct(ct->info)) {
      CTSize fofs;
      CType *fct;
      fct = lj_ctype_getfield(cts, ct, name, &fofs);
      if (fct) {
	ofs += (ptrdiff_t)fofs;
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (ctype_isconstval(fct->info)) {
	  if (fct->size >= 0x80000000u &&
	      (ctype_child(cts, fct)->info & CTF_UNSIGNED)) {
	    J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)fct->size);
	    return;
	  }
	  J->base[0] = lj_ir_kint(J, (int32_t)fct->size);
	  return;  /* Interpreter will throw for newindex. */
	} else if (ctype_isbitfield(fct->info)) {
	  if (ofs)
	    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	  crec_index_bf(J, rd, ptr, fct->info);
	  return;
	} else {
	  lj_assertJ(ctype_isfield(fct->info), "field expected");
	  sid = ctype_cid(fct->info);
	}
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2 &&
	  ((strdata(name)[0] == 'r' && strdata(name)[1] == 'e') ||
	   (strdata(name)[0] == 'i' && strdata(name)[1] == 'm'))) {
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (strdata(name)[0] == 'i') ofs += (ct->size >> 1);
	sid = ctype_cid(ct->info);
      }
    }
  }
  if (!sid) {
    if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
      CType *cct = ctype_rawchild(cts, ct);
      if (ctype_isstruct(cct->info)) {
	ct = cct;
	cd = NULL;
	if (tref_isstr(idx)) goto again;
      }
    }
    crec_index_meta(J, cts, ct, rd);
    return;
  }

  if (ofs)
    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));

  /* Resolve reference for field. */
  ct = ctype_get(cts, sid);
  if (ctype_isref(ct->info)) {
    ptr = emitir(IRT(IR_XLOAD, IRT_PTR), ptr, 0);
    sid = ctype_cid(ct->info);
    ct = ctype_get(cts, sid);
  }

  while (ctype_isattrib(ct->info))
    ct = ctype_child(cts, ct);  /* Skip attributes. */

  if (rd->data == 0) {  /* __index metamethod. */
    J->base[0] = crec_tv_ct(J, ct, sid, ptr);
  } else {  /* __newindex metamethod. */
    rd->nres = 0;
    J->needsnap = 1;
    crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
  }
}